

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void duckdb::MinMaxNOperation::
     Combine<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::LessThan>,duckdb::MinMaxNOperation>
               (MinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::LessThan> *source,
               MinMaxNState<duckdb::MinMaxFixedValue<int>,_duckdb::LessThan> *target,
               AggregateInputData *aggr_input)

{
  idx_t iVar1;
  ArenaAllocator *pAVar2;
  InvalidInputException *this;
  HeapEntry<int> *__s;
  long lVar3;
  ulong uVar4;
  string local_50;
  
  if (source->is_initialized == true) {
    if (target->is_initialized == false) {
      pAVar2 = aggr_input->allocator;
      iVar1 = (source->heap).capacity;
      (target->heap).capacity = iVar1;
      __s = (HeapEntry<int> *)ArenaAllocator::AllocateAligned(pAVar2,iVar1 << 2);
      switchD_00569a20::default(__s,0,(target->heap).capacity << 2);
      (target->heap).heap = __s;
      (target->heap).size = 0;
      target->is_initialized = true;
    }
    else if ((source->heap).capacity != (target->heap).capacity) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Mismatched n values in min/max/arg_min/arg_max","");
      InvalidInputException::InvalidInputException(this,&local_50);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((source->heap).size != 0) {
      pAVar2 = aggr_input->allocator;
      lVar3 = 0;
      uVar4 = 0;
      do {
        UnaryAggregateHeap<int,_duckdb::LessThan>::Insert
                  (&target->heap,pAVar2,(int *)((long)&((source->heap).heap)->value + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 4;
      } while (uVar4 < (source->heap).size);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &aggr_input) {
		if (!source.is_initialized) {
			// source is empty, nothing to do
			return;
		}

		if (!target.is_initialized) {
			target.Initialize(aggr_input.allocator, source.heap.Capacity());
		} else if (source.heap.Capacity() != target.heap.Capacity()) {
			throw InvalidInputException("Mismatched n values in min/max/arg_min/arg_max");
		}

		// Merge the heaps
		target.heap.Insert(aggr_input.allocator, source.heap);
	}